

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O2

void __thiscall ValidateVulnerability::SetIntensityBinIDs(ValidateVulnerability *this)

{
  int *__x;
  int __n;
  mapped_type *pmVar1;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  _Rb_tree_const_iterator<int> local_28;
  
  pmVar1 = std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](&this->vulIDToIntBinIDs_,&(this->v_).vulnerability_id);
  this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
            std::
            map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::operator[](&this->vulIDToIntBinIDs_,&(this->v_).vulnerability_id);
  __x = &(this->v_).intensity_bin_id;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique_<int_const&>
            (this_00,(const_iterator)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header,__x);
  __n = (this->v_).intensity_bin_id;
  if ((int)(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_node_count < __n) {
    local_28._M_node = &(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_28._M_node = (this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    std::advance<std::_Rb_tree_const_iterator<int>,int>(&local_28,__n);
  }
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique_<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->intensityBinIDs_,(const_iterator)local_28._M_node,__x);
  return;
}

Assistant:

inline void ValidateVulnerability::SetIntensityBinIDs() {
/* Fill sets with intensity bin IDs used in check at end to establish that
 * each vulnerability ID has entries for all intensity bin IDs. This check is
 * only relevant in single peril models, and can be supressed by the user
 * through a command line argument. */

  std::set<int>::iterator itVulHint = vulIDToIntBinIDs_[v_.vulnerability_id].end();
  vulIDToIntBinIDs_[v_.vulnerability_id].insert(itVulHint, v_.intensity_bin_id);

  std::set<int>::iterator itIntHint = intensityBinIDs_.begin();
  if (v_.intensity_bin_id > (int)intensityBinIDs_.size()) {
    itIntHint = intensityBinIDs_.end();
  } else {
    itIntHint = intensityBinIDs_.begin();
    std::advance(itIntHint, v_.intensity_bin_id);
  }
  intensityBinIDs_.insert(itIntHint, v_.intensity_bin_id);

}